

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O2

void __thiscall QWidgetLineControl::cursorForward(QWidgetLineControl *this,bool mark,int steps)

{
  int iVar1;
  CursorMode pos;
  int iVar2;
  bool bVar3;
  
  pos = *(CursorMode *)(this + 0x40);
  if (steps < 1) {
    if (steps < 0) {
      iVar2 = (int)this + 0x118;
      for (; steps != 0; steps = steps + 1) {
        iVar1 = QTextLayout::cursorMoveStyle();
        if (iVar1 == 1) {
          pos = QTextLayout::leftCursorPosition(iVar2);
        }
        else {
          pos = QTextLayout::previousCursorPosition(iVar2,pos);
        }
      }
    }
  }
  else {
    iVar2 = (int)this + 0x118;
    while (bVar3 = steps != 0, steps = steps + -1, bVar3) {
      iVar1 = QTextLayout::cursorMoveStyle();
      if (iVar1 == 1) {
        pos = QTextLayout::rightCursorPosition(iVar2);
      }
      else {
        pos = QTextLayout::nextCursorPosition(iVar2,pos);
      }
    }
  }
  moveCursor(this,pos,mark);
  return;
}

Assistant:

void cursorForward(bool mark, int steps)
    {
        int c = m_cursor;
        if (steps > 0) {
            while (steps--)
                c = cursorMoveStyle() == Qt::VisualMoveStyle ? m_textLayout.rightCursorPosition(c)
                                                             : m_textLayout.nextCursorPosition(c);
        } else if (steps < 0) {
            while (steps++)
                c = cursorMoveStyle() == Qt::VisualMoveStyle ? m_textLayout.leftCursorPosition(c)
                                                             : m_textLayout.previousCursorPosition(c);
        }
        moveCursor(c, mark);
    }